

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTree::removeItems(QGraphicsSceneBspTree *this,QSet<QGraphicsItem_*> *items)

{
  Data *this_00;
  pointer pQVar1;
  Node<QGraphicsItem_*,_QHashDummyValue> *pNVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QGraphicsItem *local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->leaves).d.size != 0) {
    uVar4 = 0;
    do {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QGraphicsItem **)0x0;
      local_58.size = 0;
      pQVar1 = QList<QList<QGraphicsItem_*>_>::data(&this->leaves);
      if (pQVar1[uVar4].d.size != 0) {
        uVar3 = 0;
        do {
          local_60 = pQVar1[uVar4].d.ptr[uVar3];
          this_00 = (items->q_hash).d;
          if (this_00 == (Data *)0x0) {
LAB_0062f5fc:
            local_40 = local_60;
            QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                      ((QPodArrayOps<QGraphicsItem*> *)&local_58,local_58.size,&local_40);
            QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)&local_58);
          }
          else {
            pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>>::
                     findNode<QGraphicsItem*>
                               ((Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *)this_00,
                                &local_60);
            if (pNVar2 == (Node<QGraphicsItem_*,_QHashDummyValue> *)0x0) goto LAB_0062f5fc;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)pQVar1[uVar4].d.size);
      }
      pQVar1 = QList<QList<QGraphicsItem_*>_>::data(&this->leaves);
      QArrayDataPointer<QGraphicsItem_*>::operator=(&pQVar1[uVar4].d,&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(this->leaves).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::removeItems(const QSet<QGraphicsItem *> &items)
{
    for (int i = 0; i < leaves.size(); ++i) {
        QList<QGraphicsItem *> newItemList;
        const QList<QGraphicsItem *> &oldItemList = leaves[i];
        for (int j = 0; j < oldItemList.size(); ++j) {
            QGraphicsItem *item = oldItemList.at(j);
            if (!items.contains(item))
                newItemList << item;
        }
        leaves[i] = newItemList;
    }
}